

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::CompileRE2(int iters,string *regexp)

{
  bool bVar1;
  string *__lhs;
  ostream *poVar2;
  LogMessage local_290;
  undefined1 local_100 [8];
  RE2 re;
  int i;
  string *regexp_local;
  int iters_local;
  
  for (re.group_names_once_._M_once = 0; re.group_names_once_._M_once < iters;
      re.group_names_once_._M_once = re.group_names_once_._M_once + 1) {
    RE2::RE2((RE2 *)local_100,regexp);
    __lhs = RE2::error_abi_cxx11_((RE2 *)local_100);
    bVar1 = std::operator==(__lhs,"");
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_290,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x2d7);
      poVar2 = LogMessage::stream(&local_290);
      std::operator<<(poVar2,"Check failed: (re.error()) == (\"\")");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_290);
    }
    RE2::~RE2((RE2 *)local_100);
  }
  return;
}

Assistant:

void CompileRE2(int iters, const string& regexp) {
  for (int i = 0; i < iters; i++) {
    RE2 re(regexp);
    CHECK_EQ(re.error(), "");
  }
}